

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O3

int LS_Generic_Stairs(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,
                     int arg4)

{
  bool bVar1;
  
  bVar1 = EV_BuildStairs(arg0,~arg3 & buildDown,(line_t_conflict *)ln,(double)arg2,
                         (double)arg1 * 0.125,0,arg4,arg3 & 2,0);
  if (((ln != (line_t *)0x0 && bVar1) && ((ln->flags & 0x200) != 0)) && (ln->special == 0xcc)) {
    *(byte *)(ln->args + 3) = (byte)ln->args[3] ^ 1;
  }
  return (int)bVar1;
}

Assistant:

FUNC(LS_Generic_Stairs)
// Generic_Stairs (tag, speed, step, dir/igntxt, reset)
{
	DFloor::EStair type = (arg3 & 1) ? DFloor::buildUp : DFloor::buildDown;
	bool res = EV_BuildStairs (arg0, type, ln,
							   arg2, SPEED(arg1), 0, arg4, arg3 & 2, 0);

	if (res && ln && (ln->flags & ML_REPEAT_SPECIAL) && ln->special == Generic_Stairs)
		// Toggle direction of next activation of repeatable stairs
		ln->args[3] ^= 1;

	return res;
}